

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cauchy_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::cauchy_dist<float>::icdf(cauchy_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  int *piVar3;
  result_type_conflict1 rVar4;
  float fVar5;
  float fVar6;
  
  if ((x <= 0.0) || (1.0 <= x)) {
    piVar3 = __errno_location();
    *piVar3 = 0x21;
    rVar4 = NAN;
  }
  else if ((x != 0.0) || (NAN(x))) {
    if ((x != 1.0) || (NAN(x))) {
      fVar1 = (this->P).theta_;
      fVar2 = (this->P).eta_;
      fVar5 = cosf(x * 3.1415927);
      fVar6 = sinf(x * 3.1415927);
      rVar4 = fVar2 - (fVar5 * fVar1) / fVar6;
    }
    else {
      rVar4 = INFINITY;
    }
  }
  else {
    rVar4 = -INFINITY;
  }
  return rVar4;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return -math::numeric_limits<result_type>::infinity();
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return icdf_(x);
    }